

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bac.h
# Opt level: O3

int Bac_ObjAlloc(Bac_Ntk_t *p,Bac_ObjType_t Type,int Fanin)

{
  int Entry;
  uint uVar1;
  char *pcVar2;
  long lVar3;
  int iVar4;
  
  Entry = (p->vType).nSize;
  if (Entry != (p->vFanin).nSize) {
    __assert_fail("iObj == Vec_IntSize(&p->vFanin)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/bac/bac.h"
                  ,0x19f,"int Bac_ObjAlloc(Bac_Ntk_t *, Bac_ObjType_t, int)");
  }
  if (Type == BAC_OBJ_PI) {
    lVar3 = 0x20;
  }
  else {
    iVar4 = Entry;
    if (Type != BAC_OBJ_PO) goto LAB_00317bc7;
    lVar3 = 0x30;
  }
  Vec_IntPush((Vec_Int_t *)((long)&p->pDesign + lVar3),Entry);
  iVar4 = (p->vType).nSize;
LAB_00317bc7:
  if (iVar4 == (p->vType).nCap) {
    if (iVar4 < 0x10) {
      pcVar2 = (p->vType).pArray;
      if (pcVar2 == (char *)0x0) {
        pcVar2 = (char *)malloc(0x10);
      }
      else {
        pcVar2 = (char *)realloc(pcVar2,0x10);
      }
      (p->vType).pArray = pcVar2;
      (p->vType).nCap = 0x10;
    }
    else {
      uVar1 = iVar4 * 2;
      pcVar2 = (p->vType).pArray;
      if (pcVar2 == (char *)0x0) {
        pcVar2 = (char *)malloc((ulong)uVar1);
      }
      else {
        pcVar2 = (char *)realloc(pcVar2,(ulong)uVar1);
      }
      (p->vType).pArray = pcVar2;
      (p->vType).nCap = uVar1;
    }
  }
  else {
    pcVar2 = (p->vType).pArray;
  }
  iVar4 = (p->vType).nSize;
  (p->vType).nSize = iVar4 + 1;
  pcVar2[iVar4] = (char)Type * '\x02';
  Vec_IntPush(&p->vFanin,Fanin);
  return Entry;
}

Assistant:

static inline int Bac_ObjAlloc( Bac_Ntk_t * p, Bac_ObjType_t Type, int Fanin )
{
    int iObj = Bac_NtkObjNum(p);
    assert( iObj == Vec_IntSize(&p->vFanin) );
    if ( Type == BAC_OBJ_PI )
        Vec_IntPush( &p->vInputs, iObj );
    else if ( Type == BAC_OBJ_PO )
        Vec_IntPush( &p->vOutputs, iObj );
    Vec_StrPush( &p->vType, (char)Abc_Var2Lit(Type, 0) );
    Vec_IntPush( &p->vFanin, Fanin );
    return iObj;
}